

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

void set_skip_txfm(MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bsize,int64_t dist)

{
  uint8_t *puVar1;
  byte tx_size;
  byte bVar2;
  MB_MODE_INFO *pMVar3;
  byte bVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  TXB_CTX txb_ctx;
  ENTROPY_CONTEXT ctxl [32];
  ENTROPY_CONTEXT ctxa [32];
  
  uVar7 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar5 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar7] - 4 & 0x1f);
  pMVar3 = *(x->e_mbd).mi;
  tx_size = ""[uVar7];
  uVar6 = 0;
  memset((x->e_mbd).tx_type_map,0,(long)(int)uVar5);
  uVar8 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar8 = uVar6;
  }
  pMVar3->inter_tx_size[0xf] = tx_size;
  auVar10 = pshuflw(ZEXT216(CONCAT11(tx_size,tx_size)),ZEXT216(CONCAT11(tx_size,tx_size)),0);
  uVar9 = auVar10._0_4_;
  pMVar3->tx_size = (char)uVar9;
  pMVar3->inter_tx_size[0] = (char)((uint)uVar9 >> 8);
  pMVar3->inter_tx_size[1] = (char)((uint)uVar9 >> 0x10);
  pMVar3->inter_tx_size[2] = (char)((uint)uVar9 >> 0x18);
  *(undefined4 *)(pMVar3->inter_tx_size + 3) = uVar9;
  *(undefined4 *)(pMVar3->inter_tx_size + 7) = uVar9;
  *(undefined4 *)(pMVar3->inter_tx_size + 0xb) = uVar9;
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    puVar1 = (x->txfm_search_info).blk_skip + uVar6;
    *puVar1 = *puVar1 | 1;
  }
  rd_stats->skip_txfm = '\x01';
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    bVar4 = (char)(x->e_mbd).bd * '\x02' - 0x10;
    dist = (long)((ulong)((uint)(1 << (bVar4 & 0x1f)) >> 1) + dist) >> (bVar4 & 0x3f);
  }
  rd_stats->sse = dist << 4;
  rd_stats->dist = dist << 4;
  av1_get_entropy_contexts(bsize,(x->e_mbd).plane,ctxa,ctxl);
  bVar4 = ""[tx_size];
  bVar2 = ""[tx_size];
  get_txb_ctx(bsize,tx_size,0,ctxa,ctxl,&txb_ctx);
  rd_stats->rate =
       (uint)(block_size_high[uVar7] >> (*(byte *)(tx_size_high_log2 + tx_size) & 0x1f)) *
       (uint)(block_size_wide[uVar7] >> (*(byte *)(tx_size_wide_log2 + tx_size) & 0x1f)) *
       (x->coeff_costs).coeff_costs[(uint)bVar4 + (uint)bVar2 + 1 >> 1 & 0xff][0].txb_skip_cost
       [txb_ctx.txb_skip_ctx][1];
  return;
}

Assistant:

static inline void set_skip_txfm(MACROBLOCK *x, RD_STATS *rd_stats,
                                 BLOCK_SIZE bsize, int64_t dist) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int n4 = bsize_to_num_blk(bsize);
  const TX_SIZE tx_size = max_txsize_rect_lookup[bsize];
  memset(xd->tx_type_map, DCT_DCT, sizeof(xd->tx_type_map[0]) * n4);
  memset(mbmi->inter_tx_size, tx_size, sizeof(mbmi->inter_tx_size));
  mbmi->tx_size = tx_size;
  for (int i = 0; i < n4; ++i)
    set_blk_skip(x->txfm_search_info.blk_skip, 0, i, 1);
  rd_stats->skip_txfm = 1;
  if (is_cur_buf_hbd(xd)) dist = ROUND_POWER_OF_TWO(dist, (xd->bd - 8) * 2);
  rd_stats->dist = rd_stats->sse = (dist << 4);
  // Though decision is to make the block as skip based on luma stats,
  // it is possible that block becomes non skip after chroma rd. In addition
  // intermediate non skip costs calculated by caller function will be
  // incorrect, if rate is set as  zero (i.e., if zero_blk_rate is not
  // accounted). Hence intermediate rate is populated to code the luma tx blks
  // as skip, the caller function based on final rd decision (i.e., skip vs
  // non-skip) sets the final rate accordingly. Here the rate populated
  // corresponds to coding all the tx blocks with zero_blk_rate (based on max tx
  // size possible) in the current block. Eg: For 128*128 block, rate would be
  // 4 * zero_blk_rate where zero_blk_rate corresponds to coding of one 64x64 tx
  // block as 'all zeros'
  ENTROPY_CONTEXT ctxa[MAX_MIB_SIZE];
  ENTROPY_CONTEXT ctxl[MAX_MIB_SIZE];
  av1_get_entropy_contexts(bsize, &xd->plane[0], ctxa, ctxl);
  ENTROPY_CONTEXT *ta = ctxa;
  ENTROPY_CONTEXT *tl = ctxl;
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  TXB_CTX txb_ctx;
  get_txb_ctx(bsize, tx_size, 0, ta, tl, &txb_ctx);
  const int zero_blk_rate = x->coeff_costs.coeff_costs[txs_ctx][PLANE_TYPE_Y]
                                .txb_skip_cost[txb_ctx.txb_skip_ctx][1];
  rd_stats->rate = zero_blk_rate *
                   (block_size_wide[bsize] >> tx_size_wide_log2[tx_size]) *
                   (block_size_high[bsize] >> tx_size_high_log2[tx_size]);
}